

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O0

UChar32 __thiscall icu_63::UCharCharacterIterator::first32(UCharCharacterIterator *this)

{
  int iVar1;
  int iVar2;
  uint local_20;
  uint16_t __c2;
  UChar32 c;
  int32_t i;
  UCharCharacterIterator *this_local;
  
  (this->super_CharacterIterator).pos = (this->super_CharacterIterator).begin;
  if ((this->super_CharacterIterator).pos < (this->super_CharacterIterator).end) {
    iVar1 = (this->super_CharacterIterator).pos;
    iVar2 = iVar1 + 1;
    local_20 = (uint)(ushort)this->text[iVar1];
    if ((((local_20 & 0xfffffc00) == 0xd800) && (iVar2 != (this->super_CharacterIterator).end)) &&
       ((this->text[iVar2] & 0xfc00U) == 0xdc00)) {
      local_20 = local_20 * 0x400 + (uint)(ushort)this->text[iVar2] + 0xfca02400;
    }
    this_local._4_4_ = local_20;
  }
  else {
    this_local._4_4_ = 0xffff;
  }
  return this_local._4_4_;
}

Assistant:

UChar32
UCharCharacterIterator::first32() {
    pos = begin;
    if(pos < end) {
        int32_t i = pos;
        UChar32 c;
        U16_NEXT(text, i, end, c);
        return c;
    } else {
        return DONE;
    }
}